

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O0

int xmlParse3986Scheme(xmlURIPtr uri,char **str)

{
  xmlChar *pxVar1;
  bool bVar2;
  char *local_28;
  char *cur;
  char **str_local;
  xmlURIPtr uri_local;
  
  if (str == (char **)0x0) {
    uri_local._4_4_ = -1;
  }
  else {
    local_28 = *str;
    if (((*local_28 < 'a') || ('z' < *local_28)) && ((*local_28 < 'A' || ('Z' < *local_28)))) {
      uri_local._4_4_ = 2;
    }
    else {
      do {
        local_28 = local_28 + 1;
        if ((((*local_28 < 'a') || (bVar2 = true, 'z' < *local_28)) &&
            ((*local_28 < 'A' || (bVar2 = true, 'Z' < *local_28)))) &&
           ((((*local_28 < '0' || (bVar2 = true, '9' < *local_28)) &&
             (bVar2 = true, *local_28 != '+')) && (bVar2 = true, *local_28 != '-')))) {
          bVar2 = *local_28 == '.';
        }
      } while (bVar2);
      if (uri != (xmlURIPtr)0x0) {
        if (uri->scheme != (char *)0x0) {
          (*xmlFree)(uri->scheme);
        }
        pxVar1 = xmlStrndup((xmlChar *)*str,(int)local_28 - (int)*str);
        uri->scheme = (char *)pxVar1;
      }
      *str = local_28;
      uri_local._4_4_ = 0;
    }
  }
  return uri_local._4_4_;
}

Assistant:

static int
xmlParse3986Scheme(xmlURIPtr uri, const char **str) {
    const char *cur;

    if (str == NULL)
	return(-1);

    cur = *str;
    if (!ISA_ALPHA(cur))
	return(2);
    cur++;
    while (ISA_ALPHA(cur) || ISA_DIGIT(cur) ||
           (*cur == '+') || (*cur == '-') || (*cur == '.')) cur++;
    if (uri != NULL) {
	if (uri->scheme != NULL) xmlFree(uri->scheme);
	uri->scheme = STRNDUP(*str, cur - *str);
    }
    *str = cur;
    return(0);
}